

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void __thiscall clickhouse::BufferedOutput::~BufferedOutput(BufferedOutput *this)

{
  BufferedOutput *in_RDI;
  
  ~BufferedOutput(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

BufferedOutput::~BufferedOutput() {
    Flush();
}